

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

void filemgr_dirty_update_commit
               (filemgr *file,filemgr_dirty_update_node *commit_node,err_log_callback *log_callback)

{
  int iVar1;
  avl_node *paVar2;
  avl_node *paVar3;
  filemgr *pfVar4;
  filemgr *file_00;
  filemgr *node;
  list remove_queue;
  list local_38;
  
  local_38.head = (list_elem *)0x0;
  local_38.tail = (list_elem *)0x0;
  if (commit_node != (filemgr_dirty_update_node *)0x0) {
    paVar2 = avl_first(&commit_node->dirty_blocks);
    while (paVar3 = paVar2, paVar3 != (avl_node *)0x0) {
      paVar2 = avl_next(paVar3);
      iVar1 = filemgr_is_writable(file,(bid_t)paVar3[1].left);
      if ((iVar1 != 0) && (*(char *)&paVar3[1].right == '\0')) {
        filemgr_write_offset
                  (file,(bid_t)paVar3[1].left,0,(ulong)file->blocksize,paVar3[1].parent,false,
                   log_callback);
      }
    }
    commit_node->expired = true;
  }
  pthread_spin_lock(&file->dirty_update_lock);
  file->latest_dirty_update = (filemgr_dirty_update_node *)0x0;
  paVar2 = avl_first(&file->dirty_update_idx);
  if (paVar2 != (avl_node *)0x0) {
    do {
      paVar3 = avl_next(paVar2);
      if ((*(char *)&paVar2[1].left == '\x01') && (*(int *)((long)&paVar2[1].left + 4) == 0)) {
        avl_remove(&file->dirty_update_idx,paVar2);
        list_push_front(&local_38,(list_elem *)paVar2);
      }
      paVar2 = paVar3;
    } while (paVar3 != (avl_node *)0x0);
  }
  pthread_spin_unlock(&file->dirty_update_lock);
  if ((filemgr *)local_38.head != (filemgr *)0x0) {
    file_00 = (filemgr *)local_38.head;
    do {
      node = file_00;
      pfVar4 = (filemgr *)list_remove(&local_38,(list_elem *)file_00);
      _filemgr_dirty_update_remove_node(file_00,(filemgr_dirty_update_node *)node);
      file_00 = pfVar4;
    } while (pfVar4 != (filemgr *)0x0);
  }
  return;
}

Assistant:

void filemgr_dirty_update_commit(struct filemgr *file,
                                 struct filemgr_dirty_update_node *commit_node,
                                 err_log_callback *log_callback)
{
    struct avl_node *a;
    struct filemgr_dirty_update_node *node;
    struct list remove_queue;
    struct list_elem *le;

    // 1. write back all blocks in the given (committed) node
    // 2. remove all other immutable dirty update entries
    list_init(&remove_queue);
    if (commit_node) {
        filemgr_dirty_update_flush(file, commit_node, log_callback);
    }

    spin_lock(&file->dirty_update_lock);
    file->latest_dirty_update = NULL;

    a = avl_first(&file->dirty_update_idx);
    while (a) {
        node = _get_entry(a, struct filemgr_dirty_update_node, avl);
        a = avl_next(a);

        if (node->immutable &&
            atomic_get_uint32_t(&node->ref_count) == 0) {
            // detach from tree and insert into remove queue
            avl_remove(&file->dirty_update_idx, &node->avl);
            list_push_front(&remove_queue, &node->le);
        }
    }

    spin_unlock(&file->dirty_update_lock);

    le = list_begin(&remove_queue);
    while (le) {
        node = _get_entry(le, struct filemgr_dirty_update_node, le);
        le = list_remove(&remove_queue, &node->le);
        _filemgr_dirty_update_remove_node(file, node);
    }
}